

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_allocator.cpp
# Opt level: O2

TupleDataChunkPart * __thiscall
duckdb::TupleDataAllocator::BuildChunkPart
          (TupleDataChunkPart *__return_storage_ptr__,TupleDataAllocator *this,
          TupleDataPinState *pin_state,TupleDataChunkState *chunk_state,idx_t append_offset,
          idx_t append_count,TupleDataChunk *chunk)

{
  idx_t *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_var;
  BlockHandle *pBVar5;
  idx_t iVar6;
  pointer pTVar7;
  ulong uVar8;
  data_ptr_t pdVar9;
  ulong uVar10;
  pointer pTVar11;
  unsigned_long uVar12;
  long lVar13;
  ulong *puVar14;
  idx_t block_size;
  unsigned_long size;
  ulong local_58;
  TupleDataPinState *local_50;
  TupleDataChunkState *local_48;
  pointer local_40;
  ulong local_38;
  
  local_50 = pin_state;
  local_48 = chunk_state;
  TupleDataChunkPart::TupleDataChunkPart
            (__return_storage_ptr__,
             (chunk->lock).super_unique_ptr<std::mutex,_std::default_delete<std::mutex>_>._M_t.
             super___uniq_ptr_impl<std::mutex,_std::default_delete<std::mutex>_>._M_t.
             super__Tuple_impl<0UL,_std::mutex_*,_std::default_delete<std::mutex>_>.
             super__Head_base<0UL,_std::mutex_*,_false>._M_head_impl);
  iVar2 = (*this->buffer_manager->_vptr_BufferManager[0xf])();
  local_58 = CONCAT44(extraout_var,iVar2);
  pTVar7 = (this->row_blocks).
           super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
           super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar11 = (this->row_blocks).
            super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
            super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((pTVar7 == pTVar11) || (pTVar11[-1].capacity - pTVar11[-1].size < this->layout->row_width)) {
    ::std::vector<duckdb::TupleDataBlock,std::allocator<duckdb::TupleDataBlock>>::
    emplace_back<duckdb::BufferManager&,unsigned_long_const&>
              ((vector<duckdb::TupleDataBlock,std::allocator<duckdb::TupleDataBlock>> *)
               &this->row_blocks,this->buffer_manager,&local_58);
    pTVar11 = (this->row_blocks).
              super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
              super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((this->partition_index).index == 0xffffffffffffffff) {
      pTVar7 = (this->row_blocks).
               super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
               super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      pBVar5 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&pTVar11[-1].handle);
      iVar6 = optional_idx::GetIndex(&this->partition_index);
      iVar6 = RadixPartitioning::RadixBits<unsigned_long>(iVar6);
      LOCK();
      (pBVar5->eviction_queue_idx).super___atomic_base<unsigned_long>._M_i = iVar6;
      UNLOCK();
      pTVar7 = (this->row_blocks).
               super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
               super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pTVar11 = (this->row_blocks).
                super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
                super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert
                    (((long)pTVar11 - (long)pTVar7 >> 5) - 1);
  __return_storage_ptr__->row_block_index = uVar3;
  pTVar7 = (this->row_blocks).
           super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
           super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_40 = pTVar7 + uVar3;
  uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(pTVar7[uVar3].size);
  __return_storage_ptr__->row_block_offset = uVar4;
  uVar8 = (pTVar7[uVar3].capacity - pTVar7[uVar3].size) / this->layout->row_width;
  if (uVar8 < append_count) {
    append_count = uVar8;
  }
  uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(append_count);
  __return_storage_ptr__->count = uVar3;
  if (this->layout->all_constant != false) goto LAB_0091fa8c;
  puVar14 = (ulong *)((local_48->heap_sizes).data + append_offset * 8);
  uVar12 = 0;
  for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
    uVar12 = uVar12 + puVar14[uVar8];
  }
  if (uVar12 == 0) {
LAB_0091fa39:
    __return_storage_ptr__->heap_block_index = 0xffffffff;
    __return_storage_ptr__->heap_block_offset = 0xffffffff;
    __return_storage_ptr__->total_heap_size = 0;
    pdVar9 = (data_ptr_t)0x0;
  }
  else {
    pTVar7 = (this->heap_blocks).
             super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
             super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar8 = local_58;
    if ((this->heap_blocks).
        super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
        super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>._M_impl.
        super__Vector_impl_data._M_start != pTVar7) {
      uVar8 = pTVar7[-1].capacity - pTVar7[-1].size;
    }
    uVar10 = *puVar14;
    if (*puVar14 < uVar8) {
      uVar10 = uVar8;
    }
    if (uVar10 < uVar12) {
      __return_storage_ptr__->total_heap_size = 0;
      uVar8 = 0;
      for (uVar12 = 0; uVar4 = (uint)uVar8, uVar3 != uVar12; uVar12 = uVar12 + 1) {
        uVar8 = (uVar8 & 0xffffffff) + puVar14[uVar12];
        if (uVar10 < uVar8) {
          uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(uVar12);
          __return_storage_ptr__->count = uVar3;
          uVar4 = __return_storage_ptr__->total_heap_size;
          break;
        }
        __return_storage_ptr__->total_heap_size = (uint32_t)uVar8;
      }
    }
    else {
      uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(uVar12);
      __return_storage_ptr__->total_heap_size = uVar4;
    }
    if (uVar4 == 0) goto LAB_0091fa39;
    pTVar7 = (this->heap_blocks).
             super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
             super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar11 = (this->heap_blocks).
              super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
              super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    uVar8 = *puVar14;
    if ((pTVar7 == pTVar11) || (pTVar11[-1].capacity - pTVar11[-1].size < uVar8)) {
      local_38 = uVar8;
      if (uVar8 < local_58) {
        local_38 = local_58;
      }
      ::std::vector<duckdb::TupleDataBlock,std::allocator<duckdb::TupleDataBlock>>::
      emplace_back<duckdb::BufferManager&,unsigned_long_const&>
                ((vector<duckdb::TupleDataBlock,std::allocator<duckdb::TupleDataBlock>> *)
                 &this->heap_blocks,this->buffer_manager,&local_38);
      if ((this->partition_index).index != 0xffffffffffffffff) {
        pBVar5 = shared_ptr<duckdb::BlockHandle,_true>::operator->
                           (&(this->heap_blocks).
                             super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>
                             .
                             super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>
                             ._M_impl.super__Vector_impl_data._M_finish[-1].handle);
        iVar6 = optional_idx::GetIndex(&this->partition_index);
        iVar6 = RadixPartitioning::RadixBits<unsigned_long>(iVar6);
        LOCK();
        (pBVar5->eviction_queue_idx).super___atomic_base<unsigned_long>._M_i = iVar6;
        UNLOCK();
      }
      lVar13 = (long)(this->heap_blocks).
                     super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
                     super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->heap_blocks).
                     super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
                     super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      lVar13 = (long)pTVar11 - (long)pTVar7;
    }
    uVar3 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert((lVar13 >> 5) - 1);
    __return_storage_ptr__->heap_block_index = uVar3;
    pTVar7 = (this->heap_blocks).
             super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
             super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(pTVar7[uVar3].size);
    __return_storage_ptr__->heap_block_offset = uVar4;
    piVar1 = &pTVar7[uVar3].size;
    *piVar1 = *piVar1 + (ulong)__return_storage_ptr__->total_heap_size;
    pdVar9 = GetBaseHeapPointer(this,local_50,__return_storage_ptr__);
  }
  __return_storage_ptr__->base_heap_ptr = pdVar9;
LAB_0091fa8c:
  local_40->size = local_40->size + (ulong)__return_storage_ptr__->count * this->layout->row_width;
  return __return_storage_ptr__;
}

Assistant:

TupleDataChunkPart TupleDataAllocator::BuildChunkPart(TupleDataPinState &pin_state, TupleDataChunkState &chunk_state,
                                                      const idx_t append_offset, const idx_t append_count,
                                                      TupleDataChunk &chunk) {
	D_ASSERT(append_count != 0);
	TupleDataChunkPart result(*chunk.lock);
	const auto block_size = buffer_manager.GetBlockSize();

	// Allocate row block (if needed)
	if (row_blocks.empty() || row_blocks.back().RemainingCapacity() < layout.GetRowWidth()) {
		row_blocks.emplace_back(buffer_manager, block_size);
		if (partition_index.IsValid()) { // Set the eviction queue index logarithmically using RadixBits
			row_blocks.back().handle->SetEvictionQueueIndex(RadixPartitioning::RadixBits(partition_index.GetIndex()));
		}
	}
	result.row_block_index = NumericCast<uint32_t>(row_blocks.size() - 1);
	auto &row_block = row_blocks[result.row_block_index];
	result.row_block_offset = NumericCast<uint32_t>(row_block.size);

	// Set count (might be reduced later when checking heap space)
	result.count = NumericCast<uint32_t>(MinValue(row_block.RemainingCapacity(layout.GetRowWidth()), append_count));
	if (!layout.AllConstant()) {
		const auto heap_sizes = FlatVector::GetData<idx_t>(chunk_state.heap_sizes);

		// Compute total heap size first
		idx_t total_heap_size = 0;
		for (idx_t i = 0; i < result.count; i++) {
			const auto &heap_size = heap_sizes[append_offset + i];
			total_heap_size += heap_size;
		}

		if (total_heap_size == 0) {
			result.SetHeapEmpty();
		} else {
			const auto heap_remaining = MaxValue<idx_t>(
			    heap_blocks.empty() ? block_size : heap_blocks.back().RemainingCapacity(), heap_sizes[append_offset]);

			if (total_heap_size <= heap_remaining) {
				// Everything fits
				result.total_heap_size = NumericCast<uint32_t>(total_heap_size);
			} else {
				// Not everything fits - determine how many we can read next
				result.total_heap_size = 0;
				for (idx_t i = 0; i < result.count; i++) {
					const auto &heap_size = heap_sizes[append_offset + i];
					if (result.total_heap_size + heap_size > heap_remaining) {
						result.count = NumericCast<uint32_t>(i);
						break;
					}
					result.total_heap_size += heap_size;
				}
			}

			if (result.total_heap_size == 0) {
				result.SetHeapEmpty();
			} else {
				// Allocate heap block (if needed)
				if (heap_blocks.empty() || heap_blocks.back().RemainingCapacity() < heap_sizes[append_offset]) {
					const auto size = MaxValue<idx_t>(block_size, heap_sizes[append_offset]);
					heap_blocks.emplace_back(buffer_manager, size);
					if (partition_index.IsValid()) { // Set the eviction queue index logarithmically using RadixBits
						heap_blocks.back().handle->SetEvictionQueueIndex(
						    RadixPartitioning::RadixBits(partition_index.GetIndex()));
					}
				}
				result.heap_block_index = NumericCast<uint32_t>(heap_blocks.size() - 1);
				auto &heap_block = heap_blocks[result.heap_block_index];
				result.heap_block_offset = NumericCast<uint32_t>(heap_block.size);

				// Mark this portion of the heap block as filled and set the pointer
				heap_block.size += result.total_heap_size;
				result.base_heap_ptr = GetBaseHeapPointer(pin_state, result);
			}
		}
	}
	D_ASSERT(result.count != 0 && result.count <= STANDARD_VECTOR_SIZE);

	// Mark this portion of the row block as filled
	row_block.size += result.count * layout.GetRowWidth();

	return result;
}